

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

bool __thiscall Tokenizer::tryToGetString(Tokenizer *this)

{
  char cVar1;
  char cVar2;
  char cVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  runtime_error *this_01;
  Stream *in_RDI;
  Mark mark;
  stringstream ss;
  Token *in_stack_fffffffffffffd58;
  Token *in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffd68;
  char in_stack_fffffffffffffd6f;
  Token *in_stack_fffffffffffffd70;
  undefined6 in_stack_fffffffffffffd78;
  char in_stack_fffffffffffffd7e;
  char in_stack_fffffffffffffd7f;
  Token *in_stack_fffffffffffffd80;
  undefined5 in_stack_fffffffffffffd90;
  string local_258 [32];
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  string local_1d0 [48];
  Mark local_1a0;
  stringstream local_198 [16];
  Token local_188 [3];
  string *in_stack_ffffffffffffff50;
  Tokenizer *in_stack_ffffffffffffff58;
  bool local_1;
  
  std::__cxx11::stringstream::stringstream(local_198);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            Stream::getMark(in_RDI);
  local_1a0 = *(Mark *)this_00;
  cVar1 = Stream::peek((Stream *)0x193994);
  if (cVar1 == '\"') {
    Stream::advance((Stream *)in_stack_fffffffffffffd60);
    while( true ) {
      cVar2 = Stream::peek((Stream *)0x1939c2);
      if (cVar2 == '\"') break;
      cVar3 = Stream::peek((Stream *)0x1939e2);
      if (cVar3 == -1) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_00,(char *)in_RDI,
                   (allocator<char> *)
                   CONCAT17(cVar1,CONCAT16(cVar2,CONCAT15(cVar3,in_stack_fffffffffffffd90))));
        makeErrorMessage(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
        std::runtime_error::runtime_error(this_01,local_1d0);
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      in_stack_fffffffffffffd7f = Stream::peek((Stream *)0x193b36);
      if (in_stack_fffffffffffffd7f == '\\') {
        Stream::advance((Stream *)in_stack_fffffffffffffd60);
        in_stack_fffffffffffffd70 = local_188;
        in_stack_fffffffffffffd7e =
             handleEscapeSequence
                       ((Tokenizer *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        std::operator<<((ostream *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd7e);
      }
      else {
        in_stack_fffffffffffffd60 = local_188;
        in_stack_fffffffffffffd6f = Stream::peek((Stream *)0x193b9d);
        std::operator<<((ostream *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd6f);
      }
      Stream::advance((Stream *)in_stack_fffffffffffffd60);
    }
    Stream::advance((Stream *)in_stack_fffffffffffffd60);
    std::__cxx11::stringstream::str();
    Token::Token(in_stack_fffffffffffffd80,
                 (TokenType *)
                 CONCAT17(in_stack_fffffffffffffd7f,
                          CONCAT16(in_stack_fffffffffffffd7e,in_stack_fffffffffffffd78)),
                 (string *)in_stack_fffffffffffffd70,
                 (Mark *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
    Token::operator=(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    Token::~Token((Token *)0x193c48);
    std::__cxx11::string::~string(local_258);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  return local_1;
}

Assistant:

bool Tokenizer::tryToGetString()
{
  std::stringstream ss;
  const Mark mark = stream_.getMark();
  if(stream_.peek() == '\"')
  {
    stream_.advance();
    while(stream_.peek() != '\"')
    {
      if(stream_.peek() == EOF)
        throw std::runtime_error(makeErrorMessage("Unexpected end of stream!"));

      else if(stream_.peek() == '\\')
      {
        stream_.advance();
        ss << handleEscapeSequence();
      }
      else
        ss << (char)stream_.peek();
      stream_.advance();
    }
    stream_.advance();
  }
  else
    return false;

  token_ = Token{TokenType::String, ss.str(), mark};
  return true;
}